

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuSingle.c
# Opt level: O1

void Fxu_MatrixComputeSingles(Fxu_Matrix *p,int fUse0,int nSingleMax)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  uint *__ptr;
  void *pvVar4;
  Fxu_Lit *pFVar5;
  Fxu_Lit *pFVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Fxu_Matrix *__size;
  Fxu_Matrix *p_00;
  long lVar12;
  Fxu_Var *pFVar13;
  ulong uVar14;
  uint uVar15;
  Fxu_Var *pVar2;
  
  p->nWeightLimit = 1 - fUse0;
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 10000;
  __ptr[1] = 0;
  p_00 = (Fxu_Matrix *)0x13880;
  pvVar4 = malloc(80000);
  *(void **)(__ptr + 2) = pvVar4;
  pVar2 = (p->lVars).pHead;
  if (pVar2 != (Fxu_Var *)0x0) {
    do {
      p->ppTailVars = &p->pOrderVars;
      p->pOrderVars = (Fxu_Var *)0x0;
      for (pFVar5 = (pVar2->lLits).pHead; pFVar5 != (Fxu_Lit *)0x0; pFVar5 = pFVar5->pVNext) {
        for (pFVar6 = pFVar5->pHPrev; pFVar6 != (Fxu_Lit *)0x0; pFVar6 = pFVar6->pHPrev) {
          pFVar13 = pFVar6->pVar;
          if (pFVar13->pOrder == (Fxu_Var *)0x0) {
            p_00 = (Fxu_Matrix *)p->ppTailVars;
            (p_00->lCubes).pHead = (Fxu_Cube *)pFVar13;
            p->ppTailVars = &pFVar13->pOrder;
            pFVar13->pOrder = (Fxu_Var *)0x1;
          }
        }
      }
      pFVar13 = p->pOrderVars;
      if ((Fxu_Var *)0x1 < pFVar13) {
        do {
          iVar10 = Fxu_SingleCountCoincidence(p_00,pFVar13,pVar2);
          if (iVar10 < 1) {
            __assert_fail("Coin > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                          ,0x9d,
                          "void Fxu_MatrixComputeSinglesOneCollect(Fxu_Matrix *, Fxu_Var *, Vec_Ptr_t *)"
                         );
          }
          if (p->nWeightLimit <= iVar10 + -2) {
            uVar1 = __ptr[1];
            uVar3 = *__ptr;
            if (uVar1 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),0x80);
                }
                uVar15 = 0x10;
              }
              else {
                uVar15 = uVar3 * 2;
                if ((int)uVar15 <= (int)uVar3) goto LAB_0043f510;
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar3 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = uVar15;
            }
LAB_0043f510:
            pvVar4 = *(void **)(__ptr + 2);
            __ptr[1] = uVar1 + 1;
            *(Fxu_Var **)((long)pvVar4 + (long)(int)uVar1 * 8) = pFVar13;
            uVar3 = *__ptr;
            if (uVar1 + 1 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (pvVar4 == (void *)0x0) {
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(pvVar4,0x80);
                }
                uVar15 = 0x10;
              }
              else {
                uVar15 = uVar3 * 2;
                if ((int)uVar15 <= (int)uVar3) goto LAB_0043f576;
                if (pvVar4 == (void *)0x0) {
                  pvVar4 = malloc((ulong)uVar3 << 4);
                }
                else {
                  pvVar4 = realloc(pvVar4,(ulong)uVar3 << 4);
                }
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = uVar15;
            }
LAB_0043f576:
            p_00 = *(Fxu_Matrix **)(__ptr + 2);
            uVar15 = uVar1 + 2;
            __ptr[1] = uVar15;
            (&(p_00->lCubes).pTail)[(int)uVar1] = (Fxu_Cube *)pVar2;
            uVar3 = *__ptr;
            if (uVar15 == uVar3) {
              if ((int)uVar3 < 0x10) {
                if (p_00 == (Fxu_Matrix *)0x0) {
                  p_00 = (Fxu_Matrix *)0x80;
                  pvVar4 = malloc(0x80);
                }
                else {
                  pvVar4 = realloc(p_00,0x80);
                }
                uVar9 = 0x10;
                __size = p_00;
              }
              else {
                uVar9 = uVar3 * 2;
                if ((int)uVar9 <= (int)uVar3) goto LAB_0043f5e7;
                __size = (Fxu_Matrix *)((ulong)uVar3 << 4);
                if (p_00 == (Fxu_Matrix *)0x0) {
                  pvVar4 = malloc((size_t)__size);
                }
                else {
                  pvVar4 = realloc(p_00,(size_t)__size);
                  __size = p_00;
                }
              }
              *(void **)(__ptr + 2) = pvVar4;
              *__ptr = uVar9;
              p_00 = __size;
            }
LAB_0043f5e7:
            __ptr[1] = uVar1 + 3;
            *(long *)(*(long *)(__ptr + 2) + (long)(int)uVar15 * 8) = (long)(iVar10 + -2);
          }
          pFVar13 = pFVar13->pOrder;
        } while (pFVar13 != (Fxu_Var *)0x1);
      }
      p_00 = p;
      Fxu_MatrixRingVarsUnmark(p);
      pVar2 = pVar2->pNext;
    } while (pVar2 != (Fxu_Var *)0x0);
  }
  uVar1 = __ptr[1];
  uVar14 = (ulong)uVar1;
  p->nSingleTotal = (int)uVar1 / 3;
  if (nSingleMax < (int)uVar1) {
    if ((int)uVar1 % 3 != 0) {
      __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                    ,0x3f,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
    }
    pvVar4 = malloc(4000);
    iVar10 = 0;
    memset(pvVar4,0,4000);
    if (2 < (int)uVar1) {
      lVar2 = *(long *)(__ptr + 2);
      uVar7 = 2;
      do {
        iVar11 = (int)*(undefined8 *)(lVar2 + uVar7 * 8);
        lVar12 = (long)iVar11 * 4;
        if (0x3e6 < iVar11) {
          lVar12 = 0xf9c;
        }
        *(int *)((long)pvVar4 + lVar12) = *(int *)((long)pvVar4 + lVar12) + 1;
        uVar7 = uVar7 + 3;
      } while (uVar7 < uVar14);
    }
    uVar7 = 999;
    do {
      iVar11 = (int)uVar7;
      iVar10 = iVar10 + *(int *)((long)pvVar4 + uVar7 * 4);
      if (nSingleMax <= iVar10) goto LAB_0043f6ef;
      uVar7 = (ulong)(iVar11 - 1);
    } while (iVar11 != 0);
    iVar11 = -1;
LAB_0043f6ef:
    if (pvVar4 != (void *)0x0) {
      free(pvVar4);
    }
    uVar3 = 0;
    if (2 < (int)uVar1) {
      lVar2 = *(long *)(__ptr + 2);
      uVar7 = 0;
      uVar8 = 2;
      do {
        if (iVar11 <= *(int *)(lVar2 + uVar8 * 8)) {
          if ((long)uVar14 <= (long)(uVar8 - 2)) goto LAB_0043f867;
          uVar15 = (uint)uVar7;
          if (uVar1 <= uVar15) {
LAB_0043f886:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                          ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
          }
          *(undefined8 *)(lVar2 + uVar7 * 8) = *(undefined8 *)(lVar2 + -0x10 + uVar8 * 8);
          if (uVar14 < uVar8) goto LAB_0043f867;
          if (((int)uVar15 < -1) || ((int)uVar1 <= (int)(uVar15 + 1))) goto LAB_0043f886;
          *(undefined8 *)(lVar2 + (ulong)(uVar15 + 1) * 8) = *(undefined8 *)(lVar2 + -8 + uVar8 * 8)
          ;
          if ((int)uVar1 <= (int)(uVar15 + 2)) goto LAB_0043f886;
          uVar3 = uVar15 + 3;
          uVar7 = (ulong)uVar3;
          *(undefined8 *)(lVar2 + (ulong)(uVar15 + 2) * 8) = *(undefined8 *)(lVar2 + uVar8 * 8);
          if (uVar3 / 3 == nSingleMax) break;
        }
        uVar3 = (uint)uVar7;
        uVar8 = uVar8 + 3;
      } while ((int)uVar8 < (int)uVar1);
    }
    if ((int)uVar1 < (int)uVar3) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    __ptr[1] = uVar3;
    p->nWeightLimit = iVar11;
  }
  uVar1 = __ptr[1];
  if (0x55555554 < uVar1 * -0x55555555 + 0x2aaaaaaa) {
    __assert_fail("Vec_PtrSize(vSingles) % 3 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/fxu/fxuSingle.c"
                  ,0x66,"void Fxu_MatrixComputeSingles(Fxu_Matrix *, int, int)");
  }
  if (0 < (int)uVar1) {
    lVar2 = *(long *)(__ptr + 2);
    uVar14 = 1;
    do {
      if ((uVar1 <= uVar14) || (iVar10 = (int)uVar14, (int)uVar1 <= iVar10 + 1)) {
LAB_0043f867:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Fxu_MatrixAddSingle(p,*(Fxu_Var **)(lVar2 + -8 + uVar14 * 8),*(Fxu_Var **)(lVar2 + uVar14 * 8)
                          ,*(int *)(lVar2 + 8 + uVar14 * 8));
      uVar14 = uVar14 + 3;
    } while (iVar10 + 2 < (int)uVar1);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  return;
}

Assistant:

void Fxu_MatrixComputeSingles( Fxu_Matrix * p, int fUse0, int nSingleMax )
{
    Fxu_Var * pVar;
    Vec_Ptr_t * vSingles;
    int i, k;
    // set the weight limit
    p->nWeightLimit = 1 - fUse0;
    // iterate through columns in the matrix and collect single-cube divisors
    vSingles = Vec_PtrAlloc( 10000 );
    Fxu_MatrixForEachVariable( p, pVar )
        Fxu_MatrixComputeSinglesOneCollect( p, pVar, vSingles );
    p->nSingleTotal = Vec_PtrSize(vSingles) / 3;
    // check if divisors should be filtered
    if ( Vec_PtrSize(vSingles) > nSingleMax )
    {
        int * pWeigtCounts, nDivCount, Weight, i, c;;
        assert( Vec_PtrSize(vSingles) % 3 == 0 );
        // count how many divisors have the given weight
        pWeigtCounts = ABC_ALLOC( int, 1000 );
        memset( pWeigtCounts, 0, sizeof(int) * 1000 );
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight >= 999 )
                pWeigtCounts[999]++;
            else
                pWeigtCounts[Weight]++;
        }
        // select the bound on the weight (above this bound, singles will be included)
        nDivCount = 0;
        for ( c = 999; c >= 0; c-- )
        {
            nDivCount += pWeigtCounts[c];
            if ( nDivCount >= nSingleMax )
                break;
        }
        ABC_FREE( pWeigtCounts );
        // collect singles with the given costs
        k = 0;
        for ( i = 2; i < Vec_PtrSize(vSingles); i += 3 )
        {
            Weight = (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles, i);
            if ( Weight < c )
                continue;
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-2) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i-1) );
            Vec_PtrWriteEntry( vSingles, k++, Vec_PtrEntry(vSingles, i) );
            if ( k/3 == nSingleMax )
                break;
        }
        Vec_PtrShrink( vSingles, k );
        // adjust the weight limit
        p->nWeightLimit = c;
    }
    // collect the selected divisors
    assert( Vec_PtrSize(vSingles) % 3 == 0 );
    for ( i = 0; i < Vec_PtrSize(vSingles); i += 3 )
    {
        Fxu_MatrixAddSingle( p, 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i), 
            (Fxu_Var *)Vec_PtrEntry(vSingles,i+1), 
            (int)(ABC_PTRUINT_T)Vec_PtrEntry(vSingles,i+2) );
    }
    Vec_PtrFree( vSingles );
}